

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O2

Channel * __thiscall Imf_3_2::ChannelList::findChannel(ChannelList *this,char *name)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  Name local_110;
  
  Name::Name(&local_110,name);
  cVar1 = std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
          ::find((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                  *)this,&local_110);
  p_Var2 = (_Base_ptr)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = cVar1._M_node + 9;
  }
  return (Channel *)p_Var2;
}

Assistant:

const Channel*
ChannelList::findChannel (const char name[]) const
{
    ChannelMap::const_iterator i = _map.find (name);
    return (i == _map.end ()) ? 0 : &i->second;
}